

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-crypt.c
# Opt level: O0

int ldesencode(lua_State *L)

{
  char *pcVar1;
  ulong size;
  int local_1d4;
  uint8_t local_1d0 [4];
  int j;
  uint8_t tail [8];
  int bytes;
  int i;
  uint8_t *buffer;
  uint8_t tmp [256];
  size_t chunksz;
  uint8_t *text;
  size_t textsz;
  uint32_t SK [32];
  lua_State *L_local;
  
  des_key(L,(uint32_t *)&textsz);
  text = (uint8_t *)0x0;
  pcVar1 = luaL_checklstring(L,2,(size_t *)&text);
  size = (ulong)(text + 8) & 0xfffffffffffffff8;
  _bytes = &buffer;
  if (0x100 < size) {
    _bytes = (uint8_t **)lua_newuserdata(L,size);
  }
  tail[4] = '\0';
  tail[5] = '\0';
  tail[6] = '\0';
  tail[7] = '\0';
  for (; (int)tail._4_4_ < (int)text + -7; tail._4_4_ = tail._4_4_ + 8) {
    des_crypt((uint32_t *)&textsz,(uint8_t *)(pcVar1 + (int)tail._4_4_),
              (uint8_t *)((long)_bytes + (long)(int)tail._4_4_));
  }
  tail._0_4_ = (int)text - tail._4_4_;
  for (local_1d4 = 0; local_1d4 < 8; local_1d4 = local_1d4 + 1) {
    if (local_1d4 < (int)tail._0_4_) {
      local_1d0[local_1d4] = pcVar1[tail._4_4_ + local_1d4];
    }
    else if (local_1d4 == tail._0_4_) {
      local_1d0[local_1d4] = 0x80;
    }
    else {
      local_1d0[local_1d4] = '\0';
    }
  }
  des_crypt((uint32_t *)&textsz,local_1d0,(uint8_t *)((long)_bytes + (long)(int)tail._4_4_));
  lua_pushlstring(L,(char *)_bytes,size);
  return 1;
}

Assistant:

static int
ldesencode(lua_State *L) {
	uint32_t SK[32];
	des_key(L, SK);

	size_t textsz = 0;
	const uint8_t * text = (const uint8_t *)luaL_checklstring(L, 2, &textsz);
	size_t chunksz = (textsz + 8) & ~7;
	uint8_t tmp[SMALL_CHUNK];
	uint8_t *buffer = tmp;
	if (chunksz > SMALL_CHUNK) {
		buffer = lua_newuserdata(L, chunksz);
	}
	int i;
	for (i=0;i<(int)textsz-7;i+=8) {
		des_crypt(SK, text+i, buffer+i);
	}
	int bytes = textsz - i;
	uint8_t tail[8];
	int j;
	for (j=0;j<8;j++) {
		if (j < bytes) {
			tail[j] = text[i+j];
		} else if (j==bytes) {
			tail[j] = 0x80;
		} else {
			tail[j] = 0;
		}
	}
	des_crypt(SK, tail, buffer+i);
	lua_pushlstring(L, (const char *)buffer, chunksz);

	return 1;
}